

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  OpCode op_00;
  expdesc e2;
  expdesc local_28;
  
  local_28.t = -1;
  local_28.f = -1;
  local_28.k = VKNUM;
  local_28.u.nval = 0.0;
  if (op == OPR_LEN) {
    luaK_exp2anyreg(fs,e);
    op_00 = OP_LEN;
  }
  else {
    if (op == OPR_NOT) {
      luaK_dischargevars(fs,e);
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKNUM:
        e->k = VFALSE;
        break;
      case VJMP:
        lVar5 = (long)(e->u).s.info;
        puVar3 = fs->f->code + lVar5;
        if ((lVar5 < 1) || (uVar4 = puVar3[-1], -1 < (char)luaP_opmodes[uVar4 & 0x3f])) {
          uVar4 = *puVar3;
        }
        else {
          puVar3 = puVar3 + -1;
        }
        *puVar3 = (uint)((uVar4 & 0x3fc0) == 0) << 6 | uVar4 & 0xffffc03f;
        break;
      case VRELOCABLE:
      case VNONRELOC:
        discharge2anyreg(fs,e);
        if (((e->k == VNONRELOC) && (uVar4 = (e->u).s.info, (uVar4 >> 8 & 1) == 0)) &&
           ((int)(uint)fs->nactvar <= (int)uVar4)) {
          fs->freereg = fs->freereg + -1;
        }
        iVar2 = luaK_code(fs,(e->u).s.info << 0x17 | 0x13,fs->ls->lastline);
        (e->u).s.info = iVar2;
        e->k = VRELOCABLE;
      }
      iVar2 = e->t;
      iVar1 = e->f;
      e->f = iVar2;
      e->t = iVar1;
      removevalues(fs,iVar2);
      removevalues(fs,e->t);
      return;
    }
    if (op != OPR_MINUS) {
      return;
    }
    if (((e->k != VKNUM) || (e->t != -1)) || (e->f != -1)) {
      luaK_exp2anyreg(fs,e);
    }
    op_00 = OP_UNM;
  }
  codearith(fs,op_00,e,&local_28);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e) {
  expdesc e2;
  e2.t = e2.f = NO_JUMP; e2.k = VKNUM; e2.u.nval = 0;
  switch (op) {
    case OPR_MINUS: {
      if (!isnumeral(e))
        luaK_exp2anyreg(fs, e);  /* cannot operate on non-numeric constants */
      codearith(fs, OP_UNM, e, &e2);
      break;
    }
    case OPR_NOT: codenot(fs, e); break;
    case OPR_LEN: {
      luaK_exp2anyreg(fs, e);  /* cannot operate on constants */
      codearith(fs, OP_LEN, e, &e2);
      break;
    }
    default: lua_assert(0);
  }
}